

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

int mpp_parse_config(char *cfg_url,rc_test_config *ea)

{
  int iVar1;
  size_t sVar2;
  char *line_00;
  int type;
  char *line;
  cfg_file cfg;
  rc_test_config *ea_local;
  char *cfg_url_local;
  
  cfg._136_8_ = ea;
  if ((cfg_url == (char *)0x0) || (sVar2 = strlen(cfg_url), sVar2 == 0)) {
    _mpp_log_l(2,0,"invalid input config url\n");
    cfg_url_local._4_4_ = -1;
  }
  else {
    line = (char *)fopen(cfg_url,"rb");
    if ((FILE *)line == (FILE *)0x0) {
      _mpp_log_l(2,0,"fopen %s failed\n",0,cfg_url);
      cfg_url_local._4_4_ = -1;
    }
    else {
      cfg.cache[0x78] = '\0';
      cfg.cache[0x79] = '\0';
      cfg.cache[0x7a] = '\0';
      cfg.cache[0x7b] = '\0';
      while (line_00 = read_cfg_line((cfg_file *)&line), line_00 != (char *)0x0) {
        invalid_cfg_cache((cfg_file *)&line);
        if (*line_00 == '[') {
          iVar1 = lookup_opt_type(line_00);
          if (iVar1 == 0) {
            parse_options((cfg_file *)&line,(rc_test_config *)cfg._136_8_);
          }
          else {
            if (iVar1 != 1) {
              _mpp_log_l(2,0,"invalid config type find\n");
              fclose((FILE *)line);
              return -1;
            }
            parse_events((cfg_file *)&line,(rc_test_config *)cfg._136_8_);
          }
        }
      }
      fclose((FILE *)line);
      cfg_url_local._4_4_ = 0;
    }
  }
  return cfg_url_local._4_4_;
}

Assistant:

int mpp_parse_config(char *cfg_url, struct rc_test_config *ea)
{
    struct cfg_file cfg;

    if (cfg_url == NULL || strlen(cfg_url) == 0) {
        mpp_err("invalid input config url\n");
        return -1;
    }

    cfg.file = fopen(cfg_url, "rb");
    if (cfg.file == NULL) {
        mpp_err("fopen %s failed\n", cfg_url);
        return -1;
    }
    cfg.cache_on = 0;

    while (1) {
        char *line = read_cfg_line(&cfg);

        if (!line)
            break;

        invalid_cfg_cache(&cfg);
        if (line[0] == '[') {
            int type = lookup_opt_type(line);

            switch (type) {
            case CONFIG_TYPE_EVENT:
                parse_events(&cfg, ea);
                break;
            case CONFIG_TYPE_OPTION:
                parse_options(&cfg, ea);
                break;
            default:
                mpp_err("invalid config type find\n");
                fclose(cfg.file);
                return -1;
            }
        }
    }

    fclose(cfg.file);

    return 0;
}